

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

string * __thiscall
clipp::usage_lines::joined_label_abi_cxx11_
          (string *__return_storage_ptr__,usage_lines *this,group *g,context *cur)

{
  context *pcVar1;
  bool bVar2;
  bool bVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  ulong uVar6;
  string *psVar7;
  parameter *ppVar8;
  arg_list *paVar9;
  const_reference pvVar10;
  bool local_192;
  byte local_191;
  allocator<char> local_161;
  string local_160 [32];
  child_t<clipp::parameter,_clipp::group> *local_140;
  child_t<clipp::parameter,_clipp::group> *p_1;
  const_iterator __end5;
  const_iterator __begin5;
  group *__range5;
  string local_f8 [7];
  bool allSingleChar;
  reference local_d8;
  child_t<clipp::parameter,_clipp::group> *p;
  const_iterator __end3;
  const_iterator __begin3;
  group *__range3;
  undefined1 local_b0 [7];
  bool first;
  undefined1 local_89;
  undefined8 local_88;
  size_type n;
  undefined1 local_78 [8];
  arg_string pfx;
  bool showOpt;
  bool flagsonly;
  allocator<char> local_29;
  context *local_28;
  context *cur_local;
  group *g_local;
  usage_lines *this_local;
  string *lbl;
  
  local_28 = cur;
  cur_local = (context *)g;
  g_local = (group *)this;
  this_local = (usage_lines *)__return_storage_ptr__;
  bVar2 = doc_formatting::merge_alternative_flags_with_common_prefix(&this->fmt_);
  if ((!bVar2) && (bVar2 = doc_formatting::merge_joinable_with_common_prefix(&this->fmt_), !bVar2))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator(&local_29);
    return __return_storage_ptr__;
  }
  cVar4 = group::begin((group *)cur_local);
  cVar5 = group::end((group *)cur_local);
  bVar2 = std::
          all_of<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,clipp::usage_lines::joined_label[abi:cxx11](clipp::group_const&,clipp::usage_lines::context_const&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>
                    (cVar4._M_current,cVar5._M_current);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",
               (allocator<char> *)(pfx.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(pfx.field_2._M_local_buf + 0xe));
    return __return_storage_ptr__;
  }
  bVar2 = group::all_optional((group *)cur_local);
  local_191 = 0;
  if (bVar2) {
    local_192 = false;
    if ((this->ommitOutermostSurrounders_ & 1U) != 0) {
      local_192 = (context *)local_28->outermost == cur_local;
    }
    local_191 = local_192 ^ 0xff;
  }
  pfx.field_2._M_local_buf[0xd] = local_191 & 1;
  group::common_flag_prefix_abi_cxx11_((arg_string *)local_78,(group *)cur_local);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    local_88 = std::__cxx11::string::size();
    bVar2 = group::exclusive((group *)cur_local);
    if ((bVar2) &&
       (bVar2 = doc_formatting::merge_alternative_flags_with_common_prefix(&this->fmt_), bVar2)) {
      local_89 = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      if ((pfx.field_2._M_local_buf[0xd] & 1U) != 0) {
        psVar7 = doc_formatting::optional_prefix_abi_cxx11_(&this->fmt_);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar7);
      }
      psVar7 = doc_formatting::alternatives_prefix_abi_cxx11_(&this->fmt_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     psVar7);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      pcVar1 = cur_local;
      bVar2 = true;
      __end3 = group::begin((group *)cur_local);
      p = (child_t<clipp::parameter,_clipp::group> *)group::end((group *)pcVar1);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                                         *)&p), bVar3) {
        local_d8 = __gnu_cxx::
                   __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                   ::operator*(&__end3);
        bVar3 = group::child_t<clipp::parameter,_clipp::group>::is_param(local_d8);
        if (bVar3) {
          if (bVar2) {
            bVar2 = false;
          }
          else {
            psVar7 = doc_formatting::alternative_param_separator_abi_cxx11_(&this->fmt_);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar7);
          }
          ppVar8 = group::child_t<clipp::parameter,_clipp::group>::as_param(local_d8);
          paVar9 = parameter::flags_abi_cxx11_(ppVar8);
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::front(paVar9);
          std::__cxx11::string::substr((ulong)local_f8,(ulong)pvVar10);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_f8);
          std::__cxx11::string::~string(local_f8);
        }
        __gnu_cxx::
        __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
        ::operator++(&__end3);
      }
      psVar7 = doc_formatting::alternatives_postfix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar7);
      if ((pfx.field_2._M_local_buf[0xd] & 1U) != 0) {
        psVar7 = doc_formatting::optional_postfix_abi_cxx11_(&this->fmt_);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar7);
      }
      local_89 = 1;
    }
    else {
      bVar2 = group::joinable((group *)cur_local);
      if ((bVar2) && (bVar2 = doc_formatting::merge_joinable_with_common_prefix(&this->fmt_), bVar2)
         ) {
        cVar4 = group::begin((group *)cur_local);
        cVar5 = group::end((group *)cur_local);
        bVar2 = std::
                all_of<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,clipp::usage_lines::joined_label[abi:cxx11](clipp::group_const&,clipp::usage_lines::context_const&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_2_>
                          ((__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                            )cVar4._M_current,
                           (__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                            )cVar5._M_current,(anon_class_8_1_54a3980e)&local_88);
        if (bVar2) {
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          if ((pfx.field_2._M_local_buf[0xd] & 1U) != 0) {
            psVar7 = doc_formatting::optional_prefix_abi_cxx11_(&this->fmt_);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar7);
          }
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_78);
          pcVar1 = cur_local;
          __end5 = group::begin((group *)cur_local);
          p_1 = (child_t<clipp::parameter,_clipp::group> *)group::end((group *)pcVar1);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                                             *)&p_1), bVar2) {
            local_140 = __gnu_cxx::
                        __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                        ::operator*(&__end5);
            bVar2 = group::child_t<clipp::parameter,_clipp::group>::is_param(local_140);
            if (bVar2) {
              ppVar8 = group::child_t<clipp::parameter,_clipp::group>::as_param(local_140);
              paVar9 = parameter::flags_abi_cxx11_(ppVar8);
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::front(paVar9);
              std::__cxx11::string::substr((ulong)local_160,(ulong)pvVar10);
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_160);
              std::__cxx11::string::~string(local_160);
            }
            __gnu_cxx::
            __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
            ::operator++(&__end5);
          }
          if ((pfx.field_2._M_local_buf[0xd] & 1U) != 0) {
            psVar7 = doc_formatting::optional_postfix_abi_cxx11_(&this->fmt_);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar7);
          }
          goto LAB_001280fe;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_161);
      std::allocator<char>::~allocator(&local_161);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&n + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&n + 7));
  }
LAB_001280fe:
  n._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_78);
  return __return_storage_ptr__;
}

Assistant:

string joined_label(const group& g, const context& cur) const
    {
        if(!fmt_.merge_alternative_flags_with_common_prefix() &&
           !fmt_.merge_joinable_with_common_prefix()) return "";

        const bool flagsonly = std::all_of(g.begin(), g.end(),
            [](const pattern& p){
                return p.is_param() && !p.as_param().flags().empty();
            });

        if(!flagsonly) return "";

        const bool showOpt = g.all_optional() &&
            !(ommitOutermostSurrounders_ && cur.outermost == &g);

        auto pfx = g.common_flag_prefix();
        if(pfx.empty()) return "";

        const auto n = pfx.size();
        if(g.exclusive() &&
           fmt_.merge_alternative_flags_with_common_prefix())
        {
            string lbl;
            if(showOpt) lbl += fmt_.optional_prefix();
            lbl += pfx + fmt_.alternatives_prefix();
            bool first = true;
            for(const auto& p : g) {
                if(p.is_param()) {
                    if(first)
                        first = false;
                    else
                        lbl += fmt_.alternative_param_separator();
                    lbl += p.as_param().flags().front().substr(n);
                }
            }
            lbl += fmt_.alternatives_postfix();
            if(showOpt) lbl += fmt_.optional_postfix();
            return lbl;
        }
        //no alternatives, but joinable flags
        else if(g.joinable() &&
            fmt_.merge_joinable_with_common_prefix())
        {
            const bool allSingleChar = std::all_of(g.begin(), g.end(),
                [&](const pattern& p){
                    return p.is_param() &&
                        p.as_param().flags().front().substr(n).size() == 1;
                });

            if(allSingleChar) {
                string lbl;
                if(showOpt) lbl += fmt_.optional_prefix();
                lbl += pfx;
                for(const auto& p : g) {
                    if(p.is_param())
                        lbl += p.as_param().flags().front().substr(n);
                }
                if(showOpt) lbl += fmt_.optional_postfix();
                return lbl;
            }
        }

        return "";
    }